

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpw.cpp
# Opt level: O2

int getPW(char *pin,char *newPIN,CK_ULONG userType)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *__ptr;
  char *prompt;
  char *__format;
  char *prompt_00;
  bool bVar4;
  size_t sStack_250;
  char password1 [256];
  char password2 [256];
  
  if (pin == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(pin);
    if ((int)sVar3 - 4U < 0xfc) {
      memcpy(password1,pin,(ulong)((int)sVar3 + 1));
    }
  }
  bVar4 = userType == 0;
  __format = "=== User PIN (%i-%i characters) ===\n";
  if (bVar4) {
    __format = "=== SO PIN (%i-%i characters) ===\n";
  }
  prompt_00 = "Please enter user PIN: ";
  if (bVar4) {
    prompt_00 = "Please enter SO PIN: ";
  }
  prompt = "Please reenter user PIN: ";
  if (bVar4) {
    prompt = "Please reenter SO PIN: ";
  }
LAB_00113a63:
  if (0xffffff03 < (int)sVar3 - 0x100U) {
    memcpy(newPIN,password1,(ulong)((int)sVar3 + 1));
    return 0;
  }
  printf(__format,4,0xff);
  iVar1 = getpin(prompt_00,password1,0x100);
  if (iVar1 < 0) {
    return 1;
  }
  if (0xffffff03 < iVar1 - 0x100U) goto code_r0x00113aa6;
  __ptr = "ERROR: The length of the PIN is out of range.\n";
  sStack_250 = 0x2e;
  goto LAB_00113af3;
code_r0x00113aa6:
  uVar2 = getpin(prompt,password2,0x100);
  if ((int)uVar2 < 0) {
    return 1;
  }
  sVar3 = (size_t)uVar2;
  iVar1 = strcmp(password1,password2);
  if (iVar1 != 0) {
    __ptr = "ERROR: The entered PINs are not equal.\n";
    sStack_250 = 0x27;
LAB_00113af3:
    fwrite(__ptr,sStack_250,1,_stderr);
    sVar3 = 0;
  }
  goto LAB_00113a63;
}

Assistant:

int getPW(char* pin, char* newPIN, CK_ULONG userType)
{
	char password1[MAX_PIN_LEN+1];
	char password2[MAX_PIN_LEN+1];
	size_t size = MAX_PIN_LEN+1;
	int length = 0;

	// Check if the user has provided a password
	if (pin)
	{
		length = strlen(pin);
		// Save the PIN if it has the correct length
		if (length >= MIN_PIN_LEN && length <= MAX_PIN_LEN)
			memcpy(password1, pin, length+1);
	}

	while (length < MIN_PIN_LEN || length > MAX_PIN_LEN)
	{
		if (userType == CKU_SO)
		{
			printf("=== SO PIN (%i-%i characters) ===\n",
				MIN_PIN_LEN, MAX_PIN_LEN);
			length = getpin("Please enter SO PIN: ",
					password1, size);
		}
		else
		{
			printf("=== User PIN (%i-%i characters) ===\n",
				MIN_PIN_LEN, MAX_PIN_LEN);
			length = getpin("Please enter user PIN: ",
					password1, size);
		}

		if (length < 0)
			return 1;
		if (length < MIN_PIN_LEN || length > MAX_PIN_LEN)
		{
			fprintf(stderr, "ERROR: The length of the PIN is out of range.\n");
			length = 0;
			continue;
		}

		if (userType == CKU_SO)
		{
			length = getpin("Please reenter SO PIN: ",
					password2, size);
		}
		else
		{
			length = getpin("Please reenter user PIN: ",
					password2, size);
		}

		if (length < 0)
			return 1;
		if (strcmp(password1, password2))
		{
			fprintf(stderr, "ERROR: The entered PINs are not equal.\n");
			length = 0;
			continue;
		}
	}

	memcpy(newPIN, password1, length+1);
	return 0;
}